

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t zip_read_data_zipx_lzma_alone(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long *plVar1;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  wchar_t wVar11;
  ssize_t bytes_avail;
  undefined4 local_40;
  int iStack_3c;
  undefined5 uStack_38;
  
  pvVar2 = a->format->data;
  if (*(char *)((long)pvVar2 + 0xa1) == '\0') {
    if (*(char *)((long)pvVar2 + 0x1b8) != '\0') {
      lzma_end((long)pvVar2 + 0x130);
      *(undefined1 *)((long)pvVar2 + 0x1b8) = 0;
    }
    pvVar7 = (void *)((long)pvVar2 + 0x130);
    memset(pvVar7,0,0x88);
    uVar4 = lzma_alone_decoder(pvVar7,0xffffffffffffffff);
    if (uVar4 == 0) {
      *(undefined1 *)((long)pvVar2 + 0x1b8) = 1;
      if ((*(long *)((long)pvVar2 + 0x78) < 9) ||
         (pvVar6 = __archive_read_ahead(a,9,(ssize_t *)0x0), pvVar6 == (void *)0x0)) {
        pcVar10 = "Truncated lzma data";
LAB_00142369:
        iVar5 = 0x54;
      }
      else {
        if ((*(char *)((long)pvVar6 + 2) != '\x05') || (*(char *)((long)pvVar6 + 3) != '\0')) {
          pcVar10 = "Invalid lzma data";
          goto LAB_00142369;
        }
        local_40 = *(undefined4 *)((long)pvVar6 + 4);
        iStack_3c = CONCAT31(0xffffff,*(undefined1 *)((long)pvVar6 + 8));
        uStack_38 = 0xffffffffff;
        if (*(long *)((long)pvVar2 + 0xa8) == 0) {
          *(undefined8 *)((long)pvVar2 + 0xb0) = 0x40000;
          pvVar6 = malloc(0x40000);
          *(void **)((long)pvVar2 + 0xa8) = pvVar6;
          if (pvVar6 != (void *)0x0) goto LAB_00142565;
          pcVar10 = "No memory for lzma decompression";
          iVar5 = 0xc;
        }
        else {
LAB_00142565:
          *(undefined4 **)((long)pvVar2 + 0x130) = &local_40;
          *(undefined8 *)((long)pvVar2 + 0x138) = 0xd;
          wVar11 = L'\0';
          *(undefined8 *)((long)pvVar2 + 0x140) = 0;
          *(undefined8 *)((long)pvVar2 + 0x148) = *(undefined8 *)((long)pvVar2 + 0xa8);
          *(undefined8 *)((long)pvVar2 + 0x150) = *(undefined8 *)((long)pvVar2 + 0xb0);
          *(undefined8 *)((long)pvVar2 + 0x158) = 0;
          iVar5 = lzma_code(pvVar7,0);
          if (iVar5 == 0) {
            __archive_read_consume(a,9);
            *(long *)((long)pvVar2 + 0x78) = *(long *)((long)pvVar2 + 0x78) + -9;
            *(long *)((long)pvVar2 + 0x80) = *(long *)((long)pvVar2 + 0x80) + 9;
            *(undefined1 *)((long)pvVar2 + 0xa1) = 1;
            bVar3 = true;
            goto LAB_00142381;
          }
          pcVar10 = "lzma stream initialization error";
          iVar5 = 0x16;
        }
      }
      bVar3 = false;
      archive_set_error(&a->archive,iVar5,pcVar10);
      wVar11 = L'\xffffffe2';
    }
    else {
      bVar3 = false;
      archive_set_error(&a->archive,-1,"lzma initialization failed(%d)",(ulong)uVar4);
      wVar11 = L'\xffffffe7';
    }
LAB_00142381:
    if (!bVar3) {
      return wVar11;
    }
  }
  pvVar7 = __archive_read_ahead(a,1,(ssize_t *)&local_40);
  if (iStack_3c < 0) {
    pcVar10 = "Truncated lzma file body";
    iVar5 = 0x54;
LAB_00142452:
    archive_set_error(&a->archive,iVar5,pcVar10);
LAB_001424f3:
    wVar11 = L'\xffffffe2';
  }
  else {
    lVar9 = CONCAT44(iStack_3c,local_40);
    if (*(long *)((long)pvVar2 + 0x78) < CONCAT44(iStack_3c,local_40)) {
      lVar9 = *(long *)((long)pvVar2 + 0x78);
    }
    *(void **)((long)pvVar2 + 0x130) = pvVar7;
    *(long *)((long)pvVar2 + 0x138) = lVar9;
    *(undefined8 *)((long)pvVar2 + 0x140) = 0;
    *(undefined8 *)((long)pvVar2 + 0x148) = *(undefined8 *)((long)pvVar2 + 0xa8);
    lVar9 = *(long *)(*(long *)((long)pvVar2 + 0x70) + 0x30) - *(long *)((long)pvVar2 + 0x88);
    if (*(long *)((long)pvVar2 + 0xb0) < lVar9) {
      lVar9 = *(long *)((long)pvVar2 + 0xb0);
    }
    *(long *)((long)pvVar2 + 0x150) = lVar9;
    *(undefined8 *)((long)pvVar2 + 0x158) = 0;
    uVar4 = lzma_code((long)pvVar2 + 0x130,0);
    if (uVar4 != 0) {
      if (uVar4 != 1) {
        if (uVar4 == 9) {
          pcVar10 = "lzma data error (error %d)";
          uVar8 = 9;
        }
        else {
          pcVar10 = "lzma unknown error %d";
          uVar8 = (ulong)uVar4;
        }
        archive_set_error(&a->archive,-1,pcVar10,uVar8);
        goto LAB_001424f3;
      }
      if (*(long *)((long)pvVar2 + 0x140) != *(long *)((long)pvVar2 + 0x78)) {
        pcVar10 = "lzma alone premature end of stream";
        iVar5 = -1;
        goto LAB_00142452;
      }
      *(undefined1 *)((long)pvVar2 + 0xa2) = 1;
    }
    lVar9 = *(long *)((long)pvVar2 + 0x140);
    __archive_read_consume(a,lVar9);
    *(long *)((long)pvVar2 + 0x80) = *(long *)((long)pvVar2 + 0x80) + lVar9;
    *(long *)((long)pvVar2 + 0x88) =
         *(long *)((long)pvVar2 + 0x88) + *(long *)((long)pvVar2 + 0x158);
    plVar1 = (long *)((long)pvVar2 + 0x78);
    *plVar1 = *plVar1 - lVar9;
    if (*plVar1 == 0) {
      *(undefined1 *)((long)pvVar2 + 0xa2) = 1;
    }
    if (*(char *)((long)pvVar2 + 0xa2) != '\0') {
      lzma_end((long)pvVar2 + 0x130);
      *(undefined1 *)((long)pvVar2 + 0x1b8) = 0;
    }
    *size = *(size_t *)((long)pvVar2 + 0x158);
    *buff = *(void **)((long)pvVar2 + 0xa8);
    wVar11 = L'\0';
  }
  return wVar11;
}

Assistant:

static int
zip_read_data_zipx_lzma_alone(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct zip* zip = (struct zip *)(a->format->data);
	int ret;
	lzma_ret lz_ret;
	const void* compressed_buf;
	ssize_t bytes_avail, in_bytes, to_consume;

	(void) offset; /* UNUSED */

	/* Initialize decompressor if not yet initialized. */
	if (!zip->decompress_init) {
		ret = zipx_lzma_alone_init(a, zip);
		if (ret != ARCHIVE_OK)
			return (ret);
	}

	/* Fetch more compressed data. The same note as in deflate handler
	 * applies here as well:
	 *
	 * Note: '1' here is a performance optimization. Recall that the
	 * decompression layer returns a count of available bytes; asking for
	 * more than that forces the decompressor to combine reads by copying
	 * data.
	 */
	compressed_buf = __archive_read_ahead(a, 1, &bytes_avail);
	if (bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated lzma file body");
		return (ARCHIVE_FATAL);
	}

	/* Set decompressor parameters. */
	in_bytes = (ssize_t)zipmin(zip->entry_bytes_remaining, bytes_avail);

	zip->zipx_lzma_stream.next_in = compressed_buf;
	zip->zipx_lzma_stream.avail_in = in_bytes;
	zip->zipx_lzma_stream.total_in = 0;
	zip->zipx_lzma_stream.next_out = zip->uncompressed_buffer;
	zip->zipx_lzma_stream.avail_out =
		/* These lzma_alone streams lack end of stream marker, so let's
		 * make sure the unpacker won't try to unpack more than it's
		 * supposed to. */
		(size_t)zipmin((int64_t) zip->uncompressed_buffer_size,
		    zip->entry->uncompressed_size -
		    zip->entry_uncompressed_bytes_read);
	zip->zipx_lzma_stream.total_out = 0;

	/* Perform the decompression. */
	lz_ret = lzma_code(&zip->zipx_lzma_stream, LZMA_RUN);
	switch(lz_ret) {
		case LZMA_DATA_ERROR:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "lzma data error (error %d)", (int) lz_ret);
			return (ARCHIVE_FATAL);

		/* This case is optional in lzma alone format. It can happen,
		 * but most of the files don't have it. (GitHub #1257) */
		case LZMA_STREAM_END:
			if((int64_t) zip->zipx_lzma_stream.total_in !=
			    zip->entry_bytes_remaining)
			{
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "lzma alone premature end of stream");
				return (ARCHIVE_FATAL);
			}

			zip->end_of_entry = 1;
			break;

		case LZMA_OK:
			break;

		default:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "lzma unknown error %d", (int) lz_ret);
			return (ARCHIVE_FATAL);
	}

	to_consume = (ssize_t)zip->zipx_lzma_stream.total_in;

	/* Update pointers. */
	__archive_read_consume(a, to_consume);
	zip->entry_bytes_remaining -= to_consume;
	zip->entry_compressed_bytes_read += to_consume;
	zip->entry_uncompressed_bytes_read += zip->zipx_lzma_stream.total_out;

	if(zip->entry_bytes_remaining == 0) {
		zip->end_of_entry = 1;
	}

	/* Free lzma decoder handle because we'll no longer need it. */
	/* This cannot be folded into LZMA_STREAM_END handling above
	 * because the stream end marker is not required in this format. */
	if(zip->end_of_entry) {
		lzma_end(&zip->zipx_lzma_stream);
		zip->zipx_lzma_valid = 0;
	}

	/* Return values. */
	*size = (size_t)zip->zipx_lzma_stream.total_out;
	*buff = zip->uncompressed_buffer;

	/* If we're here, then we're good! */
	return (ARCHIVE_OK);
}